

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linearizer.c
# Opt level: O2

Pseudo * indexed_load(Proc *proc,Pseudo *index_pseudo)

{
  byte *pbVar1;
  uint uVar2;
  ravitype_t rVar3;
  ravitype_t type;
  Pseudo *pPVar4;
  Pseudo *pPVar5;
  Instruction *pIVar6;
  Pseudo *pPVar7;
  Pseudo *pPVar8;
  Pseudo *pseudo;
  opcode op;
  
  if (((undefined1  [48])*index_pseudo & (undefined1  [48])0xf) != (undefined1  [48])0xe) {
    __assert_fail("index_pseudo->type == PSEUDO_INDEXED",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x524,"Pseudo *indexed_load(Proc *, Pseudo *)");
  }
  if ((undefined1  [40])((undefined1  [40])index_pseudo->field_3 & (undefined1  [40])0x200000000) !=
      (undefined1  [40])0x0) {
    __assert_fail("!index_pseudo->index_info.used",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                  ,0x525,"Pseudo *indexed_load(Proc *, Pseudo *)");
  }
  if ((undefined1  [40])((undefined1  [40])index_pseudo->field_3 & (undefined1  [40])0x100000000) ==
      (undefined1  [40])0x0) {
    pPVar4 = (index_pseudo->field_3).index_info.container;
    if (((undefined1  [48])*pPVar4 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x530,"Pseudo *indexed_load(Proc *, Pseudo *)");
    }
    pPVar5 = (index_pseudo->field_3).index_info.key;
    if (((undefined1  [48])*pPVar5 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x531,"Pseudo *indexed_load(Proc *, Pseudo *)");
    }
    uVar2 = (index_pseudo->field_3).range_in_use;
    rVar3 = (index_pseudo->field_3).index_info.key_type;
    if (uVar2 == 0x20) {
      op = op_iaget;
    }
    else if (uVar2 == 0x40) {
      op = op_faget;
    }
    else if (uVar2 == 0x80) {
      op = op_tget;
    }
    else {
      op = op_get;
    }
    type = (index_pseudo->field_3).index_info.target_type;
    if (rVar3 == RAVI_TSTRING) {
      if ((uVar2 == 0x40) || (uVar2 == 0x20)) {
        __assert_fail("container_type != RAVI_TARRAYINT && container_type != RAVI_TARRAYFLT",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                      ,0x547,"Pseudo *indexed_load(Proc *, Pseudo *)");
      }
      op = op + op_add;
    }
    else if (rVar3 == RAVI_TNUMINT) {
      op = op + op_ret;
    }
    pIVar6 = allocate_instruction(proc,op,(index_pseudo->field_3).index_info.line_number);
    pPVar7 = add_instruction_operand(proc,pIVar6,pPVar4);
    pPVar8 = add_instruction_operand(proc,pIVar6,pPVar5);
    free_temp_pseudo(proc,pPVar4,false);
    free_temp_pseudo(proc,pPVar5,false);
    pbVar1 = (byte *)((long)&index_pseudo->field_3 + 0xc);
    *pbVar1 = *pbVar1 | 2;
    if (pPVar7 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pPVar7,false);
    }
    if (pPVar8 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pPVar8,false);
    }
    pseudo = allocate_temp_pseudo(proc,type,true);
    add_instruction_target(proc,pIVar6,pseudo);
    add_instruction(proc,pIVar6);
  }
  else {
    pPVar4 = (index_pseudo->field_3).index_info.container;
    if (((undefined1  [48])*pPVar4 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("container_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x50e,"Pseudo *indexed_load_from_global(Proc *, Pseudo *)");
    }
    pPVar5 = (index_pseudo->field_3).index_info.key;
    if (((undefined1  [48])*pPVar5 & (undefined1  [48])0xf) == (undefined1  [48])0xe) {
      __assert_fail("key_pseudo->type != PSEUDO_INDEXED",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/linearizer.c"
                    ,0x50f,"Pseudo *indexed_load_from_global(Proc *, Pseudo *)");
    }
    pseudo = allocate_temp_pseudo(proc,RAVI_TANY,true);
    pIVar6 = allocate_instruction(proc,op_loadglobal,(index_pseudo->field_3).index_info.line_number)
    ;
    pPVar7 = add_instruction_operand(proc,pIVar6,pPVar4);
    pPVar8 = add_instruction_operand(proc,pIVar6,pPVar5);
    add_instruction_target(proc,pIVar6,pseudo);
    add_instruction(proc,pIVar6);
    free_temp_pseudo(proc,pPVar4,false);
    free_temp_pseudo(proc,pPVar5,false);
    pbVar1 = (byte *)((long)&index_pseudo->field_3 + 0xc);
    *pbVar1 = *pbVar1 | 2;
    if (pPVar7 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pPVar7,false);
    }
    if (pPVar8 != (Pseudo *)0x0) {
      free_temp_pseudo(proc,pPVar8,false);
    }
  }
  return pseudo;
}

Assistant:

static Pseudo *indexed_load(Proc *proc, Pseudo *index_pseudo)
{
	assert(index_pseudo->type == PSEUDO_INDEXED);
	assert(!index_pseudo->index_info.used);
	if (index_pseudo->index_info.is_global)
		return indexed_load_from_global(proc, index_pseudo);

	ravitype_t container_type = index_pseudo->index_info.container_type;
	ravitype_t key_type = index_pseudo->index_info.key_type;
	ravitype_t target_type = index_pseudo->index_info.target_type;
	unsigned line_number = index_pseudo->index_info.line_number;
	Pseudo *container_pseudo = index_pseudo->index_info.container;
	Pseudo *key_pseudo = index_pseudo->index_info.key;

	assert(container_pseudo->type != PSEUDO_INDEXED);
	assert(key_pseudo->type != PSEUDO_INDEXED);

	int op = op_get;
	switch (container_type) {
	case RAVI_TTABLE:
		op = op_tget;
		break;
	case RAVI_TARRAYINT:
		op = op_iaget;
		break;
	case RAVI_TARRAYFLT:
		op = op_faget;
		break;
	default:
		break;
	}
	/* Note we rely upon ordering of enums here */
	switch (key_type) {
	case RAVI_TNUMINT:
		op++;
		break;
	case RAVI_TSTRING:
		assert(container_type != RAVI_TARRAYINT && container_type != RAVI_TARRAYFLT);
		op += 2;
		break;
	default:
		break;
	}
	Instruction *insn = allocate_instruction(proc, (enum opcode)op, line_number);
	Pseudo *tofree1 = add_instruction_operand(proc, insn, container_pseudo);
	Pseudo *tofree2 = add_instruction_operand(proc, insn, key_pseudo);
	free_temp_pseudo(proc, container_pseudo, false);
	free_temp_pseudo(proc, key_pseudo, false);
	index_pseudo->index_info.used = 1;
	if (tofree1)
		free_temp_pseudo(proc, tofree1, false);
	if (tofree2)
		free_temp_pseudo(proc, tofree2, false);
	Pseudo *target_pseudo = allocate_temp_pseudo(proc, target_type, true);
	add_instruction_target(proc, insn, target_pseudo);
	add_instruction(proc, insn);
	return target_pseudo;
}